

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void PPrintAsp(TidyDocImpl *doc,uint indent,Node *node)

{
  int iVar1;
  uint uVar2;
  uint mode;
  
  iVar1 = *(int *)((doc->config).value + 0x5a);
  uVar2 = *(uint *)((doc->config).value + 0x5d);
  if ((iVar1 == 0) || (*(int *)((doc->config).value + 0x5c) == 0)) {
    prvTidySetOptionInt(doc,TidyWrapLen,0xffffffff);
  }
  AddString(&doc->pprint,"<%");
  mode = 2;
  if (iVar1 != 0) {
    mode = 0x10;
  }
  PPrintText(doc,mode,indent,node);
  AddString(&doc->pprint,"%>");
  prvTidySetOptionInt(doc,TidyWrapLen,(ulong)uVar2);
  return;
}

Assistant:

static void PPrintAsp( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wrapAsp  = cfgBool( doc, TidyWrapAsp );
    Bool wrapJste = cfgBool( doc, TidyWrapJste );
    uint saveWrap = WrapOffCond( doc, !wrapAsp || !wrapJste );

    AddString( pprint, "<%" );
    PPrintText( doc, (wrapAsp ? CDATA : COMMENT), indent, node );
    AddString( pprint, "%>" );

    /* PCondFlushLine( doc, indent ); */
    WrapOn( doc, saveWrap );
}